

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O2

void __thiscall
wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow
          (StringifyWalker<wasm::ReconstructStringifyWalker> *this)

{
  Id IVar1;
  Expression *this_00;
  ArenaVector<wasm::Expression_*> *pAVar2;
  SeparatorReason reason;
  SeparatorReason reason_00;
  SeparatorReason reason_01;
  SeparatorReason reason_02;
  SeparatorReason reason_03;
  SeparatorReason reason_04;
  SeparatorReason reason_05;
  SeparatorReason reason_06;
  SeparatorReason reason_07;
  Try *pTVar3;
  Expression **ppEVar4;
  Block *pBVar5;
  If *pIVar6;
  ReconstructStringifyWalker *self;
  undefined1 in_stack_00000008 [16];
  _Variadic_union<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
  in_stack_ffffffffffffffb8;
  ArenaVector<wasm::Expression_*> *in_stack_ffffffffffffffc0;
  ArenaVector<wasm::Expression_*> *pAVar7;
  Iterator __begin3;
  
  this_00 = *(this->controlFlowQueue).c.
             super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_front
            (&(this->controlFlowQueue).c);
  IVar1 = this_00->_id;
  if (IVar1 == BlockId) {
    pBVar5 = Expression::cast<wasm::Block>(this_00);
    reason_05.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    reason_05.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_05);
    __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar2 = (ArenaVector<wasm::Expression_*> *)
             (pBVar5->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    pAVar7 = &pBVar5->list;
    while ((__begin3.parent != pAVar2 || (pAVar7 != &pBVar5->list))) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&stack0xffffffffffffffc0);
      Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
      ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              *)this,ppEVar4);
      __begin3.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin3.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    reason_06.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = pAVar7;
    reason_06.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_06);
    return;
  }
  if (IVar1 == IfId) {
    pIVar6 = Expression::cast<wasm::If>(this_00);
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    reason_03.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_03);
    Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
    ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            *)this,&pIVar6->ifTrue);
    if (pIVar6->ifFalse == (Expression *)0x0) goto LAB_00a1cc5d;
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    reason_04.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_04);
  }
  else {
    if (IVar1 != LoopId) {
      if (IVar1 == TryId) {
        pTVar3 = Expression::cast<wasm::Try>(this_00);
        reason.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._8_8_ = in_stack_ffffffffffffffc0;
        reason.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._M_u = in_stack_ffffffffffffffb8;
        ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason);
        Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
        ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                *)this,&pTVar3->body);
        reason_00.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._8_8_ = in_stack_ffffffffffffffc0;
        reason_00.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
        ._M_u = in_stack_ffffffffffffffb8;
        ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_00);
        __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
        pAVar2 = (ArenaVector<wasm::Expression_*> *)
                 (pTVar3->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements;
        pAVar7 = &pTVar3->catchBodies;
        while ((__begin3.parent != pAVar2 || (pAVar7 != &pTVar3->catchBodies))) {
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                    operator*((Iterator *)&stack0xffffffffffffffc0);
          reason_01.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          ._8_8_ = pAVar7;
          reason_01.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          ._M_u = in_stack_ffffffffffffffb8;
          ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_01);
          Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                  *)this,ppEVar4);
          reason_02.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          ._8_8_ = pAVar7;
          reason_02.reason.
          super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          .
          super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
          ._M_u = in_stack_ffffffffffffffb8;
          ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_02);
          __begin3.parent =
               (ArenaVector<wasm::Expression_*> *)
               ((long)&((__begin3.parent)->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data + 1);
        }
        return;
      }
      if (IVar1 != TryTableId) {
        __assert_fail("Properties::isControlFlowStructure(curr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                      ,0x76,
                      "void wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::dequeueControlFlow() [SubType = wasm::ReconstructStringifyWalker]"
                     );
      }
      handle_unreachable("unexpected expression",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                         ,0x77);
    }
    pIVar6 = (If *)Expression::cast<wasm::Loop>(this_00);
    reason_07.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._8_8_ = in_stack_ffffffffffffffc0;
    reason_07.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::End>
    ._M_u = in_stack_ffffffffffffffb8;
    ReconstructStringifyWalker::addUniqueSymbol((ReconstructStringifyWalker *)this,reason_07);
  }
  Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  ::walk((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
          *)this,&pIVar6->ifFalse);
LAB_00a1cc5d:
  ReconstructStringifyWalker::addUniqueSymbol
            ((ReconstructStringifyWalker *)this,(SeparatorReason)in_stack_00000008);
  return;
}

Assistant:

void StringifyWalker<SubType>::dequeueControlFlow() {
  auto& queue = controlFlowQueue;
  Expression* curr = queue.front();
  queue.pop();
  DBG(std::cerr << "controlFlowQueue.pop: " << ShallowExpression{curr} << ", "
                << curr << "\n");

  // TODO: Issue #5796, Make a ControlChildIterator
  switch (curr->_id) {
    case Expression::Id::BlockId: {
      auto* block = curr->cast<Block>();
      addUniqueSymbol(SeparatorReason::makeBlockStart(block));
      for (auto& child : block->list) {
        Super::walk(child);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::IfId: {
      auto* iff = curr->cast<If>();
      addUniqueSymbol(SeparatorReason::makeIfStart(iff));
      Super::walk(iff->ifTrue);
      if (iff->ifFalse) {
        addUniqueSymbol(SeparatorReason::makeElseStart());
        Super::walk(iff->ifFalse);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::TryId: {
      auto* tryy = curr->cast<Try>();
      addUniqueSymbol(SeparatorReason::makeTryBodyStart());
      Super::walk(tryy->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      for (auto& child : tryy->catchBodies) {
        addUniqueSymbol(SeparatorReason::makeTryCatchStart());
        Super::walk(child);
        addUniqueSymbol(SeparatorReason::makeEnd());
      }
      break;
    }
    case Expression::Id::LoopId: {
      auto* loop = curr->cast<Loop>();
      addUniqueSymbol(SeparatorReason::makeLoopStart(loop));
      Super::walk(loop->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    default: {
      assert(Properties::isControlFlowStructure(curr));
      WASM_UNREACHABLE("unexpected expression");
    }
  }
}